

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# World.cpp
# Opt level: O3

double __thiscall World::getRadianceWithLight(World *this,Vector3 *P,Vector3 *N,Vector3 *O)

{
  double dVar1;
  double dVar2;
  Vector3 L;
  Collision collision;
  Vector3 local_c8;
  Ray local_b0;
  Collision local_80;
  
  operator-(O,P);
  dVar1 = Vector3::dot(&local_c8,N);
  dVar2 = 0.0;
  if (1e-05 <= (double)(-(ulong)(dVar1 < -1e-05) & 0xbff0000000000000 |
                       ~-(ulong)(dVar1 < -1e-05) & -(ulong)(1e-05 < dVar1) & 0x3ff0000000000000)) {
    Ray::Ray(&local_b0,P,&local_c8);
    findNearestPrimitive(&local_80,this,&local_b0);
    if ((local_80.crash == true) &&
       (dVar1 = Vector3::len(&local_c8), local_80.dist - dVar1 < -1e-05)) {
      return 0.0;
    }
    dVar2 = 1.0;
  }
  return dVar2;
}

Assistant:

double World::getRadianceWithLight(const Vector3 &P, const Vector3 &N, const Vector3 &O)
{
    Vector3 L = (O - P);
    if (sign(L.dot(N)) < EPS) return 0;
    Collision collision = findNearestPrimitive(Ray(P, L));
    if (collision.crash && sign(collision.dist - L.len()) < 0) return 0;
    else return 1;
}